

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

void Aig_ManPartDivide(Vec_Ptr_t *vResult,Vec_Int_t *vDomain,int nPartSize,int nOverSize)

{
  int iVar1;
  Vec_Int_t *p;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Vec_Int_t *vPart;
  int nOverSize_local;
  int nPartSize_local;
  Vec_Int_t *vDomain_local;
  Vec_Ptr_t *vResult_local;
  
  if (nPartSize != 0) {
    iVar1 = Vec_IntSize(vDomain);
    if (nPartSize < iVar1) {
      vPart._0_4_ = nOverSize;
      if (nPartSize <= nOverSize) {
        printf("Overlap size (%d) is more or equal than the partition size (%d).\n",
               (ulong)(uint)nOverSize,(ulong)(uint)nPartSize);
        printf("Adjusting it to be equal to half of the partition size.\n");
        vPart._0_4_ = nPartSize / 2;
      }
      if ((int)vPart < nPartSize) {
        local_30 = 0;
        while( true ) {
          iVar1 = Vec_IntSize(vDomain);
          if (iVar1 <= local_30) break;
          p = Vec_IntAlloc(nPartSize);
          for (local_2c = 0; local_2c < nPartSize; local_2c = local_2c + 1) {
            iVar1 = Vec_IntSize(vDomain);
            if (local_30 < iVar1) {
              iVar1 = Vec_IntEntry(vDomain,local_30);
              Vec_IntPush(p,iVar1);
            }
            local_30 = local_30 + 1;
          }
          iVar1 = Vec_IntSize(p);
          if ((int)vPart < iVar1) {
            Vec_PtrPush(vResult,p);
          }
          else {
            Vec_IntFree(p);
          }
          local_30 = local_30 - (int)vPart;
        }
        return;
      }
      __assert_fail("nOverSize < nPartSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartReg.c"
                    ,0x20c,"void Aig_ManPartDivide(Vec_Ptr_t *, Vec_Int_t *, int, int)");
    }
  }
  __assert_fail("nPartSize && Vec_IntSize(vDomain) > nPartSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartReg.c"
                ,0x205,"void Aig_ManPartDivide(Vec_Ptr_t *, Vec_Int_t *, int, int)");
}

Assistant:

void Aig_ManPartDivide( Vec_Ptr_t * vResult, Vec_Int_t * vDomain, int nPartSize, int nOverSize )
{
    Vec_Int_t * vPart;
    int i, Counter;
    assert( nPartSize && Vec_IntSize(vDomain) > nPartSize );
    if ( nOverSize >= nPartSize )
    {
        printf( "Overlap size (%d) is more or equal than the partition size (%d).\n", nOverSize, nPartSize );
        printf( "Adjusting it to be equal to half of the partition size.\n" );
        nOverSize = nPartSize/2;
    }
    assert( nOverSize < nPartSize );
    for ( Counter = 0; Counter < Vec_IntSize(vDomain); Counter -= nOverSize )
    {
        vPart = Vec_IntAlloc( nPartSize );
        for ( i = 0; i < nPartSize; i++, Counter++ )
            if ( Counter < Vec_IntSize(vDomain) )
                Vec_IntPush( vPart, Vec_IntEntry(vDomain, Counter) );
        if ( Vec_IntSize(vPart) <= nOverSize )
            Vec_IntFree(vPart);
        else
            Vec_PtrPush( vResult, vPart );
    }
}